

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::DescriptorPoolExtensionFinder::Find
          (DescriptorPoolExtensionFinder *this,int number,ExtensionInfo *output)

{
  byte bVar1;
  MessageFactory *pMVar2;
  char *pcVar3;
  int iVar4;
  FieldDescriptor *this_00;
  Descriptor *pDVar5;
  undefined4 extraout_var;
  TcParseTableBase *pTVar6;
  EnumDescriptor *pEVar7;
  Nonnull<const_char_*> pcVar8;
  bool bVar9;
  string_view str;
  string_view v;
  LogMessage LStack_28;
  
  this_00 = DescriptorPool::FindExtensionByNumber(this->pool_,this->containing_type_,number);
  if (this_00 != (FieldDescriptor *)0x0) {
    output->type = this_00->type_;
    bVar1 = this_00->field_0x1;
    bVar9 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar9) {
      pcVar8 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                         (bVar9,0xbf < bVar1,
                          "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar8 != (Nonnull<const_char_*>)0x0) {
      Find();
LAB_004a482b:
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&LStack_28);
    }
    output->is_repeated = (bool)((byte)this_00->field_0x1 >> 5 & 1);
    bVar9 = FieldDescriptor::is_packed(this_00);
    output->is_packed = bVar9;
    output->descriptor = this_00;
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this_00->type_ * 4) == 8) {
      (output->field_6).enum_validity_check.func = ValidateEnumUsingDescriptor;
      pEVar7 = FieldDescriptor::enum_type(this_00);
      (output->field_6).message_info.tc_table = (TcParseTableBase *)pEVar7;
    }
    else if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this_00->type_ * 4) == 10) {
      pMVar2 = this->factory_;
      pDVar5 = FieldDescriptor::message_type(this_00);
      iVar4 = (*pMVar2->_vptr_MessageFactory[2])(pMVar2,pDVar5);
      (output->field_6).message_info.prototype = (MessageLite *)CONCAT44(extraout_var,iVar4);
      pTVar6 = MessageLite::GetTcParseTable((MessageLite *)CONCAT44(extraout_var,iVar4));
      (output->field_6).message_info.tc_table = pTVar6;
      if ((output->field_6).enum_validity_check.func == (EnumValidityFuncWithArg *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&LStack_28,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_heavy.cc"
                   ,0x11d,"output->message_info.prototype != nullptr");
        str._M_str = "Extension factory\'s GetPrototype() returned nullptr; extension: ";
        str._M_len = 0x40;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (&LStack_28,str);
        pcVar3 = (this_00->all_names_).payload_;
        v._M_len = (ulong)*(ushort *)(pcVar3 + 2);
        v._M_str = pcVar3 + ~v._M_len;
        absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_28,v);
        goto LAB_004a482b;
      }
    }
  }
  return this_00 != (FieldDescriptor *)0x0;
}

Assistant:

bool DescriptorPoolExtensionFinder::Find(int number, ExtensionInfo* output) {
  const FieldDescriptor* extension =
      pool_->FindExtensionByNumber(containing_type_, number);
  if (extension == nullptr) {
    return false;
  } else {
    output->type = extension->type();
    output->is_repeated = extension->is_repeated();
    output->is_packed = extension->is_packed();
    output->descriptor = extension;
    if (extension->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      output->message_info.prototype =
          factory_->GetPrototype(extension->message_type());
      output->message_info.tc_table =
          output->message_info.prototype->GetTcParseTable();
      ABSL_CHECK(output->message_info.prototype != nullptr)
          << "Extension factory's GetPrototype() returned nullptr; extension: "
          << extension->full_name();

    } else if (extension->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      output->enum_validity_check.func = ValidateEnumUsingDescriptor;
      output->enum_validity_check.arg = extension->enum_type();
    }

    return true;
  }
}